

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O2

void __thiscall
llbuild::basic::StringList::StringList<std::__cxx11::string>
          (StringList *this,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          values)

{
  size_type sVar1;
  char *__dest;
  long lVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  
  pbVar4 = values.Data;
  this->contents = (char *)0x0;
  this->size = 0;
  pbVar5 = pbVar4;
  for (lVar3 = values.Length << 5; lVar3 != 0; lVar3 = lVar3 + -0x20) {
    std::__cxx11::string::string((string *)&value,(string *)pbVar5);
    this->size = value._M_string_length + this->size + 1;
    std::__cxx11::string::_M_dispose();
    pbVar5 = pbVar5 + 1;
  }
  __dest = (char *)operator_new__(this->size + 1);
  this->contents = __dest;
  lVar3 = values.Length << 5;
  while( true ) {
    if (lVar3 == 0) {
      *__dest = '\0';
      return;
    }
    std::__cxx11::string::string((string *)&value,(string *)pbVar4);
    lVar2 = std::__cxx11::string::find((char)&value,0);
    sVar1 = value._M_string_length;
    if (lVar2 != -1) break;
    memcpy(__dest,value._M_dataplus._M_p,value._M_string_length);
    pcVar6 = __dest + sVar1;
    __dest = pcVar6 + 1;
    *pcVar6 = '\0';
    std::__cxx11::string::_M_dispose();
    pbVar4 = pbVar4 + 1;
    lVar3 = lVar3 + -0x20;
  }
  __assert_fail("value.find(\'\\0\') == StringRef::npos",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                ,0x40,
                "llbuild::basic::StringList::StringList(const ArrayRef<StringType>) [StringType = std::basic_string<char>]"
               );
}

Assistant:

explicit StringList(const ArrayRef<StringType> values) {
    // Construct the concatenated data.
    for (auto value: values) {
      size += value.size() + 1;
    }
    // Make sure to allocate at least 1 byte.
    char* p = nullptr;
    contents = p = new char[size + 1];
    for (auto value: values) {
      assert(value.find('\0') == StringRef::npos);
      memcpy(p, value.data(), value.size());
      p += value.size();
      *p++ = '\0';
    }
    *p = '\0';
  }